

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<int,4ul>>
               (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *src,
               vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  undefined8 *puVar1;
  pointer paVar2;
  undefined8 uVar3;
  ulong uVar4;
  pointer puVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  __node_base _Var8;
  uint uVar9;
  size_type __new_size;
  long lVar10;
  bool bVar11;
  bool bVar12;
  uint32_t vidx;
  unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
  vdata;
  uint local_84;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *local_80;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x0) {
    bVar12 = false;
  }
  else {
    uVar4 = (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    bVar12 = false;
    if (((long)(src->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(src->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start >> 4 == uVar4) && (2 < uVar4)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      puVar5 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar12 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish == puVar5;
      if (bVar12) {
        __new_size = 1;
      }
      else {
        lVar10 = 0;
        uVar4 = 0;
        uVar9 = 0;
        local_80 = src;
        local_78 = dst;
        local_70 = faceVertexIndices;
        do {
          local_84 = puVar5[uVar4];
          if (uVar9 < local_84) {
            uVar9 = local_84;
          }
          sVar6 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&local_68,&local_84);
          if (sVar6 == 0) {
            paVar2 = (local_80->
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pmVar7 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_84);
            puVar1 = (undefined8 *)((long)paVar2->_M_elems + lVar10);
            uVar3 = puVar1[1];
            *(undefined8 *)pmVar7->_M_elems = *puVar1;
            *(undefined8 *)(pmVar7->_M_elems + 2) = uVar3;
          }
          else {
            pmVar7 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_84);
            paVar2 = (local_80->
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((((pmVar7->_M_elems[0] != *(int *)((long)paVar2->_M_elems + lVar10)) ||
                 (pmVar7->_M_elems[1] != *(int *)((long)paVar2->_M_elems + lVar10 + 4))) ||
                (pmVar7->_M_elems[2] != *(int *)((long)paVar2->_M_elems + lVar10 + 8))) ||
               (pmVar7->_M_elems[3] != *(int *)((long)paVar2->_M_elems + lVar10 + 0xc)))
            goto LAB_00388a8c;
          }
          uVar4 = uVar4 + 1;
          puVar5 = (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x10;
          bVar11 = uVar4 < (ulong)((long)(local_70->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5
                                  >> 2);
          bVar12 = !bVar11;
        } while (bVar11);
        __new_size = (size_type)(uVar9 + 1);
        dst = local_78;
      }
      ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
                (dst,__new_size);
      memset((dst->super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)
             ._M_impl.super__Vector_impl_data._M_start,0,__new_size << 4);
      for (_Var8._M_nxt = local_68._M_before_begin._M_nxt; _Var8._M_nxt != (_Hash_node_base *)0x0;
          _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt) {
        uVar3 = *(undefined8 *)((long)&_Var8._M_nxt[2]._M_nxt + 4);
        paVar2 = (dst->
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start + *(uint *)&_Var8._M_nxt[1]._M_nxt;
        *(undefined8 *)paVar2->_M_elems = *(undefined8 *)((long)&_Var8._M_nxt[1]._M_nxt + 4);
        *(undefined8 *)(paVar2->_M_elems + 2) = uVar3;
      }
LAB_00388a8c:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar12;
}

Assistant:

bool TryConvertFacevaryingToVertexInt(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}